

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O1

int lws_wsi_extract_from_loop(lws *wsi)

{
  lws_event_loop_ops *plVar1;
  _func_void_lws_ptr *p_Var2;
  _func_int_lws_ptr *p_Var3;
  
  if ((wsi->desc).sockfd != -1) {
    __remove_wsi_socket_from_fds(wsi);
  }
  plVar1 = ((wsi->a).context)->event_loop_ops;
  p_Var2 = plVar1->destroy_wsi;
  if (p_Var2 == (_func_void_lws_ptr *)0x0) {
    p_Var3 = plVar1->wsi_logical_close;
    if (p_Var3 != (_func_int_lws_ptr *)0x0) {
      (*p_Var3)(wsi);
      return 1;
    }
  }
  else {
    (*p_Var2)(wsi);
  }
  return 0;
}

Assistant:

int
lws_wsi_extract_from_loop(struct lws *wsi)
{
	if (lws_socket_is_valid(wsi->desc.sockfd))
		__remove_wsi_socket_from_fds(wsi);

	if (!wsi->a.context->event_loop_ops->destroy_wsi &&
	    wsi->a.context->event_loop_ops->wsi_logical_close) {
		wsi->a.context->event_loop_ops->wsi_logical_close(wsi);
		return 1; /* close / destroy continues async */
	}

	if (wsi->a.context->event_loop_ops->destroy_wsi)
		wsi->a.context->event_loop_ops->destroy_wsi(wsi);

	return 0; /* he is destroyed */
}